

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O2

string * __thiscall
glcts::DrawBuffersIndexedBlending::GenVS_abi_cxx11_
          (string *__return_storage_ptr__,DrawBuffersIndexedBlending *this)

{
  ostringstream os;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  std::operator<<(&oStack_188,
                  "#version 300 es                        \nprecision highp float;                 \nprecision highp int;                   \nlayout(location = 0) in vec4 position; \nvoid main() {                          \n    gl_Position = position;            \n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawBuffersIndexedBlending::GenVS()
{
	std::ostringstream os;
	os << "#version 300 es                        \n"
		  "precision highp float;                 \n"
		  "precision highp int;                   \n"
		  "layout(location = 0) in vec4 position; \n"
		  "void main() {                          \n"
		  "    gl_Position = position;            \n"
		  "}";
	return os.str();
}